

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall HighsSparseMatrix::unapplyScale(HighsSparseMatrix *this,HighsScale *scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  long lVar9;
  long lVar10;
  
  if (this->format_ == kColwise) {
    iVar1 = this->num_col_;
    if (0 < (long)iVar1) {
      piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        iVar2 = piVar4[lVar9];
        lVar10 = (long)iVar2;
        iVar3 = piVar4[lVar9 + 1];
        if (iVar2 < iVar3) {
          do {
            pdVar8[lVar10] = pdVar8[lVar10] / (pdVar6[lVar9] * pdVar7[piVar5[lVar10]]);
            lVar10 = lVar10 + 1;
          } while (iVar3 != lVar10);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar1);
    }
  }
  else {
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        iVar2 = piVar4[lVar9];
        lVar10 = (long)iVar2;
        iVar3 = piVar4[lVar9 + 1];
        if (iVar2 < iVar3) {
          do {
            pdVar8[lVar10] = pdVar8[lVar10] / (pdVar6[piVar5[lVar10]] * pdVar7[lVar9]);
            lVar10 = lVar10 + 1;
          } while (iVar3 != lVar10);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar1);
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}